

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

string * __thiscall
cfd::core::CryptoUtil::EncodeBase58_abi_cxx11_
          (string *__return_storage_ptr__,CryptoUtil *this,ByteData *data)

{
  CfdException *this_00;
  char *wally_string;
  int ret;
  char *output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  int local_64;
  WallyUtil *local_60;
  string local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  ByteData::GetBytes(&local_38,(ByteData *)this);
  local_60 = (WallyUtil *)0x0;
  local_64 = wally_base58_from_bytes
                       (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_38.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,0,(char **)&local_60);
  if (local_64 == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_
              ((string *)__return_storage_ptr__,local_60,wally_string);
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_58._M_dataplus._M_p = "cfdcore_util.cpp";
  local_58._M_string_length._0_4_ = 0x401;
  local_58.field_2._M_allocated_capacity = (long)"CfdEncodeBase58" + 3;
  logger::log<int&>((CfdSourceLocation *)&local_58,kCfdLogLevelWarning,
                    "wally_base58_from_bytes NG[{}].",&local_64);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode base58 error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string CryptoUtil::EncodeBase58(const ByteData &data) {
  std::vector<uint8_t> byte_array = data.GetBytes();
  char *output = nullptr;

  int ret = wally_base58_from_bytes(
      byte_array.data(), byte_array.size(), 0, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_base58_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "Decode base58 error.");
  }
  return WallyUtil::ConvertStringAndFree(output);
}